

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_test.cpp
# Opt level: O0

void __thiscall
Buffer_testCreateBuffer_Test::~Buffer_testCreateBuffer_Test(Buffer_testCreateBuffer_Test *this)

{
  void *in_RDI;
  
  ~Buffer_testCreateBuffer_Test((Buffer_testCreateBuffer_Test *)0x13b238);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(Buffer, testCreateBuffer) {
    char data[65535];
    for (int i=0; i<5; i++) {
        std::cout << data[i] << std::endl;
    };
    std::string s("hello");
    memcpy(&data, s.c_str(), s.size());
    auto offset = s.size();
    std::cout << std::string(data) << std::endl;
    std::cout << sizeof(data) << std::endl;
    std::cout << s.size() << std::endl;

    std::string w(" world");
    memcpy(&data[offset], w.c_str(), w.size());
    std::cout << std::string(data) << std::endl;
    memset(data, 0, 65535);
    std::cout << std::string(data) << std::endl;
    std::cout << "done" << std::endl;

    std::vector<char> foo;
    std::copy(s.begin(), s.end(), std::back_inserter(foo));

    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

    std::copy(w.begin(), w.end(), std::back_inserter(foo));
    std::cout << std::string(foo.begin(), foo.end()) << std::endl;

}